

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalGenerator::Generate(cmGlobalGenerator *this)

{
  Snapshot snapshot;
  Snapshot snapshot_00;
  Snapshot snapshot_01;
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference ppcVar4;
  cmMakefile *pcVar5;
  cmake *pcVar6;
  pointer ppVar7;
  ostream *poVar8;
  reference pbVar9;
  PolicyID id;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *this_00;
  float local_428;
  cmCommandContext local_3f8;
  Snapshot local_3d0;
  cmListFileBacktrace local_3b8;
  string local_378;
  _Self local_358;
  _Self local_350;
  iterator iter;
  undefined1 local_328 [8];
  ostringstream w;
  cmCommandContext local_1b0;
  Snapshot local_188;
  cmListFileBacktrace local_170;
  allocator local_129;
  string local_128;
  _Self local_108;
  _Self local_100;
  iterator it;
  Snapshot local_d0;
  cmListFileBacktrace local_b8;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  uint local_14;
  cmGlobalGenerator *pcStack_10;
  uint i;
  cmGlobalGenerator *this_local;
  
  pcStack_10 = this;
  (*this->_vptr_cmGlobalGenerator[0x23])();
  ProcessEvaluationFiles(this);
  for (local_14 = 0; uVar2 = (ulong)local_14,
      sVar3 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::size
                        (&this->LocalGenerators), uVar2 < sVar3; local_14 = local_14 + 1) {
    this_00 = &this->LocalGenerators;
    ppcVar4 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (this_00,(ulong)local_14);
    pcVar5 = cmLocalGenerator::GetMakefile(*ppcVar4);
    SetCurrentMakefile(this,pcVar5);
    ppcVar4 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (this_00,(ulong)local_14);
    (*(*ppcVar4)->_vptr_cmLocalGenerator[2])();
    ppcVar4 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (this_00,(ulong)local_14);
    pcVar5 = cmLocalGenerator::GetMakefile(*ppcVar4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,"CMAKE_SKIP_INSTALL_RULES",&local_39);
    bVar1 = cmMakefile::IsOn(pcVar5,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ppcVar4 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                          (&this->LocalGenerators,(ulong)local_14);
      cmLocalGenerator::GenerateInstallRules(*ppcVar4);
    }
    ppcVar4 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (&this->LocalGenerators,(ulong)local_14);
    cmLocalGenerator::GenerateTestFiles(*ppcVar4);
    pcVar6 = this->CMakeInstance;
    uVar2 = (ulong)local_14;
    sVar3 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::size
                      (&this->LocalGenerators);
    local_428 = (float)sVar3;
    cmake::UpdateProgress(pcVar6,"Generating",((float)uVar2 + 1.0) / local_428);
  }
  SetCurrentMakefile(this,(cmMakefile *)0x0);
  bVar1 = GenerateCPackPropertiesFile(this);
  if (!bVar1) {
    pcVar6 = GetCMakeInstance(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_70,"Could not write CPack properties file.",&local_71);
    cmState::Snapshot::Snapshot(&local_d0,(cmState *)0x0);
    cmCommandContext::cmCommandContext((cmCommandContext *)&it);
    snapshot.Position.Tree = local_d0.Position.Tree;
    snapshot.State = local_d0.State;
    snapshot.Position.Position = local_d0.Position.Position;
    cmListFileBacktrace::cmListFileBacktrace(&local_b8,snapshot,(cmCommandContext *)&it);
    cmake::IssueMessage(pcVar6,FATAL_ERROR,&local_70,&local_b8,false);
    cmListFileBacktrace::~cmListFileBacktrace(&local_b8);
    cmCommandContext::~cmCommandContext((cmCommandContext *)&it);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  local_100._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>_>
       ::begin(&this->BuildExportSets);
  while( true ) {
    local_108._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>_>
         ::end(&this->BuildExportSets);
    bVar1 = std::operator!=(&local_100,&local_108);
    if (!bVar1) {
      CheckRuleHashes(this);
      WriteSummary(this);
      if (this->ExtraGenerator != (cmExternalMakefileProjectGenerator *)0x0) {
        (*this->ExtraGenerator->_vptr_cmExternalMakefileProjectGenerator[6])();
      }
      bVar1 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&this->CMP0042WarnTargets);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
        cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&iter,(cmPolicies *)0x2a,id);
        poVar8 = std::operator<<((ostream *)local_328,(string *)&iter);
        std::operator<<(poVar8,"\n");
        std::__cxx11::string::~string((string *)&iter);
        std::operator<<((ostream *)local_328,
                        "MACOSX_RPATH is not specified for the following targets:\n");
        local_350._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->CMP0042WarnTargets);
        while( true ) {
          local_358._M_node =
               (_Base_ptr)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(&this->CMP0042WarnTargets);
          bVar1 = std::operator!=(&local_350,&local_358);
          if (!bVar1) break;
          poVar8 = std::operator<<((ostream *)local_328," ");
          pbVar9 = std::
                   _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_350);
          poVar8 = std::operator<<(poVar8,(string *)pbVar9);
          std::operator<<(poVar8,"\n");
          std::
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&local_350);
        }
        pcVar6 = GetCMakeInstance(this);
        std::__cxx11::ostringstream::str();
        cmState::Snapshot::Snapshot(&local_3d0,(cmState *)0x0);
        cmCommandContext::cmCommandContext(&local_3f8);
        snapshot_01.Position.Tree = local_3d0.Position.Tree;
        snapshot_01.State = local_3d0.State;
        snapshot_01.Position.Position = local_3d0.Position.Position;
        cmListFileBacktrace::cmListFileBacktrace(&local_3b8,snapshot_01,&local_3f8);
        cmake::IssueMessage(pcVar6,AUTHOR_WARNING,&local_378,&local_3b8,false);
        cmListFileBacktrace::~cmListFileBacktrace(&local_3b8);
        cmCommandContext::~cmCommandContext(&local_3f8);
        std::__cxx11::string::~string((string *)&local_378);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
      }
      cmake::UpdateProgress(this->CMakeInstance,"Generating done",-1.0);
      return;
    }
    ppVar7 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>
             ::operator->(&local_100);
    bVar1 = cmExportFileGenerator::GenerateImportFile(&ppVar7->second->super_cmExportFileGenerator);
    if ((!bVar1) && (bVar1 = cmSystemTools::GetErrorOccuredFlag(), !bVar1)) break;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>
    ::operator++(&local_100);
  }
  pcVar6 = GetCMakeInstance(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"Could not write export file.",&local_129);
  cmState::Snapshot::Snapshot(&local_188,(cmState *)0x0);
  cmCommandContext::cmCommandContext(&local_1b0);
  snapshot_00.Position.Tree = local_188.Position.Tree;
  snapshot_00.State = local_188.State;
  snapshot_00.Position.Position = local_188.Position.Position;
  cmListFileBacktrace::cmListFileBacktrace(&local_170,snapshot_00,&local_1b0);
  cmake::IssueMessage(pcVar6,FATAL_ERROR,&local_128,&local_170,false);
  cmListFileBacktrace::~cmListFileBacktrace(&local_170);
  cmCommandContext::~cmCommandContext(&local_1b0);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  return;
}

Assistant:

void cmGlobalGenerator::Generate()
{
  // Create a map from local generator to the complete set of targets
  // it builds by default.
  this->InitializeProgressMarks();

  this->ProcessEvaluationFiles();

  // Generate project files
  for (unsigned int i = 0; i < this->LocalGenerators.size(); ++i)
    {
    this->SetCurrentMakefile(this->LocalGenerators[i]->GetMakefile());
    this->LocalGenerators[i]->Generate();
    if(!this->LocalGenerators[i]->GetMakefile()->IsOn(
      "CMAKE_SKIP_INSTALL_RULES"))
      {
      this->LocalGenerators[i]->GenerateInstallRules();
      }
    this->LocalGenerators[i]->GenerateTestFiles();
    this->CMakeInstance->UpdateProgress("Generating",
      (static_cast<float>(i)+1.0f)/
       static_cast<float>(this->LocalGenerators.size()));
    }
  this->SetCurrentMakefile(0);

  if(!this->GenerateCPackPropertiesFile())
    {
    this->GetCMakeInstance()->IssueMessage(
      cmake::FATAL_ERROR, "Could not write CPack properties file.");
    }

  for (std::map<std::string, cmExportBuildFileGenerator*>::iterator
      it = this->BuildExportSets.begin(); it != this->BuildExportSets.end();
      ++it)
    {
    if (!it->second->GenerateImportFile()
        && !cmSystemTools::GetErrorOccuredFlag())
      {
      this->GetCMakeInstance()
          ->IssueMessage(cmake::FATAL_ERROR, "Could not write export file.");
      return;
      }
    }
  // Update rule hashes.
  this->CheckRuleHashes();

  this->WriteSummary();

  if (this->ExtraGenerator != 0)
    {
    this->ExtraGenerator->Generate();
    }

  if(!this->CMP0042WarnTargets.empty())
    {
    std::ostringstream w;
    w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0042) << "\n";
    w << "MACOSX_RPATH is not specified for"
         " the following targets:\n";
    for(std::set<std::string>::iterator
      iter = this->CMP0042WarnTargets.begin();
      iter != this->CMP0042WarnTargets.end();
      ++iter)
      {
      w << " " << *iter << "\n";
      }
    this->GetCMakeInstance()->IssueMessage(cmake::AUTHOR_WARNING, w.str());
    }

  this->CMakeInstance->UpdateProgress("Generating done", -1);
}